

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O1

PmError alsa_in_open(PmInternal *midi,void *driverInfo)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  undefined1 uVar4;
  PmError PVar5;
  undefined8 in_RAX;
  uint *ptr;
  long lVar6;
  size_t sVar7;
  undefined8 *__s;
  undefined8 uStack_40;
  undefined8 uStack_38;
  snd_seq_addr_t addr;
  
  __s = &uStack_38;
  pvVar3 = descriptors[midi->device_id].descriptor;
  uStack_40 = 0x104777;
  uStack_38 = in_RAX;
  ptr = (uint *)pm_alloc(0x20);
  if (ptr == (uint *)0x0) {
    PVar5 = pmInsufficientMemory;
  }
  else {
    uStack_40 = 0x104788;
    PVar5 = alsa_use_queue();
    if (~pmNoData < PVar5) {
      uStack_40 = 0x104795;
      lVar6 = snd_seq_port_info_sizeof();
      lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
      __s = (undefined8 *)((long)&uStack_38 + lVar6);
      *(undefined8 *)((long)&uStack_40 + lVar6) = 0x1047ab;
      sVar7 = snd_seq_port_info_sizeof();
      *(undefined8 *)((long)&uStack_40 + lVar6) = 0x1047bb;
      memset(__s,0,sVar7);
      iVar1 = midi->device_id;
      *(undefined8 *)((long)&uStack_40 + lVar6) = 0x1047c6;
      snd_seq_port_info_set_port(__s,iVar1);
      *(undefined8 *)((long)&uStack_40 + lVar6) = 0x1047d3;
      snd_seq_port_info_set_capability(__s,3);
      *(undefined8 *)((long)&uStack_40 + lVar6) = 0x1047e0;
      snd_seq_port_info_set_type(__s,0x100002);
      *(undefined8 *)((long)&uStack_40 + lVar6) = 0x1047ed;
      snd_seq_port_info_set_port_specified(__s,1);
      *(undefined8 *)((long)&uStack_40 + lVar6) = 0x1047fc;
      PVar5 = snd_seq_create_port(seq);
      if (~pmNoData < PVar5) {
        midi->descriptor = ptr;
        *ptr = (uint)((ulong)pvVar3 >> 8) & 0xff;
        ptr[1] = (uint)pvVar3 & 0xff;
        ptr[2] = midi->device_id;
        ptr[3] = 0;
        ptr[6] = 0;
        *(undefined8 *)((long)&uStack_40 + lVar6) = 0x104831;
        lVar6 = snd_seq_port_subscribe_sizeof();
        __s = (undefined8 *)((long)__s + -(lVar6 + 0xfU & 0xfffffffffffffff0));
        *(undefined8 *)((long)__s + -8) = 0x104847;
        sVar7 = snd_seq_port_subscribe_sizeof();
        *(undefined8 *)((long)__s + -8) = 0x104854;
        memset(__s,0,sVar7);
        *(undefined8 *)((long)__s + -8) = 0x104860;
        uVar4 = snd_seq_client_id(seq);
        uStack_38._0_7_ = CONCAT16(uVar4,(undefined6)uStack_38);
        uStack_38 = CONCAT17((char)ptr[2],(undefined7)uStack_38);
        *(undefined8 *)((long)__s + -8) = 0x10487b;
        snd_seq_port_subscribe_set_dest(__s,(long)&uStack_38 + 6);
        uStack_38._0_7_ = CONCAT16((char)*ptr,(undefined6)uStack_38);
        uStack_38 = CONCAT17((char)ptr[1],(undefined7)uStack_38);
        *(undefined8 *)((long)__s + -8) = 0x104894;
        snd_seq_port_subscribe_set_sender(__s,(long)&uStack_38 + 6);
        *(undefined8 *)((long)__s + -8) = 0x1048a1;
        snd_seq_port_subscribe_set_time_update(__s,1);
        *(undefined8 *)((long)__s + -8) = 0x1048ab;
        snd_seq_port_subscribe_set_time_real(__s,0);
        *(undefined8 *)((long)__s + -8) = 0x1048ba;
        PVar5 = snd_seq_subscribe_port(seq,__s);
        if (~pmNoData < PVar5) {
          return pmNoData;
        }
        uVar2 = ptr[2];
        *(undefined8 *)((long)__s + -8) = 0x1048d0;
        snd_seq_delete_port(seq,uVar2);
      }
      *(undefined8 *)((long)__s + -8) = 0x1048e7;
      alsa_unuse_queue();
    }
    *(undefined8 *)((long)__s + -8) = 0x1048ef;
    pm_free(ptr);
    *(undefined8 *)((long)__s + -8) = 0x10490d;
    pm_hosterror = PVar5;
    get_alsa_error_text(pm_hosterror_text,0x100,PVar5);
    PVar5 = pmHostError;
  }
  return PVar5;
}

Assistant:

static PmError alsa_in_open(PmInternal *midi, void *driverInfo)
{
    void *client_port = descriptors[midi->device_id].descriptor;
    alsa_descriptor_type desc = (alsa_descriptor_type) 
        pm_alloc(sizeof(alsa_descriptor_node));
    snd_seq_port_info_t *info;
    snd_seq_port_subscribe_t *sub;
    snd_seq_addr_t addr;
    int err;

    if (!desc) return pmInsufficientMemory;
    
    err = alsa_use_queue();
    if (err < 0) goto free_desc;

    snd_seq_port_info_alloca(&info);
    snd_seq_port_info_set_port(info, midi->device_id);
    snd_seq_port_info_set_capability(info, SND_SEQ_PORT_CAP_WRITE |
                                     SND_SEQ_PORT_CAP_READ);
    snd_seq_port_info_set_type(info, SND_SEQ_PORT_TYPE_MIDI_GENERIC | 
                                     SND_SEQ_PORT_TYPE_APPLICATION);
    snd_seq_port_info_set_port_specified(info, 1);
    err = snd_seq_create_port(seq, info);
    if (err < 0) goto free_queue;

    /* fill in fields of desc, which is passed to pm_write routines */
    midi->descriptor = desc;
    desc->client = GET_DESCRIPTOR_CLIENT(client_port);
    desc->port = GET_DESCRIPTOR_PORT(client_port);
    desc->this_port = midi->device_id;
    desc->in_sysex = 0;

    desc->error = 0;

    VERBOSE printf("snd_seq_connect_from: %d %d %d\n", 
                   desc->this_port, desc->client, desc->port);
    snd_seq_port_subscribe_alloca(&sub);
    addr.client = snd_seq_client_id(seq);
    addr.port = desc->this_port;
    snd_seq_port_subscribe_set_dest(sub, &addr);
    addr.client = desc->client;
    addr.port = desc->port;
    snd_seq_port_subscribe_set_sender(sub, &addr);
    snd_seq_port_subscribe_set_time_update(sub, 1);
    /* this doesn't seem to work: messages come in with real timestamps */
    snd_seq_port_subscribe_set_time_real(sub, 0);
    err = snd_seq_subscribe_port(seq, sub);
    /* err = 
       snd_seq_connect_from(seq, desc->this_port, desc->client, desc->port); */
    if (err < 0) goto free_this_port;  /* clean up and return on error */
    return pmNoError;

 free_this_port:
    snd_seq_delete_port(seq, desc->this_port);
 free_queue:
    alsa_unuse_queue();
 free_desc:
    pm_free(desc);
    pm_hosterror = err;
    if (err < 0) {
        get_alsa_error_text(pm_hosterror_text, PM_HOST_ERROR_MSG_LEN, err);
    }
    return pmHostError;
}